

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O2

void __thiscall
Js::ScopeInfo::SaveSymbolInfo(ScopeInfo *this,Symbol *sym,MapSymbolData *mapSymbolData)

{
  ushort uVar1;
  bool bVar2;
  PropertyId i;
  PropertyId propertyId;
  
  uVar1 = *(ushort *)&sym->field_0x42;
  if ((uVar1 >> 0xe & 1) == 0) {
    if ((uVar1 & 0x10) == 0) goto LAB_007dc587;
    i = Symbol::EnsureScopeSlot(sym,mapSymbolData->byteCodeGenerator,mapSymbolData->func);
  }
  else {
    i = mapSymbolData->nonScopeSymbolCount + sym->scope->scopeSlotCount;
    mapSymbolData->nonScopeSymbolCount = mapSymbolData->nonScopeSymbolCount + 1;
    if (((uVar1 & 0x10) == 0) && ((sym->field_0x43 & 0x40) == 0)) goto LAB_007dc587;
  }
  propertyId = Symbol::EnsurePosition(sym,mapSymbolData->func);
  SetSymbolId(this,i,propertyId);
  SetSymbolType(this,i,sym->symbolType);
  SetHasFuncAssignment(this,i,sym->hasFuncAssignment);
  SetIsBlockVariable(this,i,SUB41((*(ushort *)&sym->field_0x42 & 2) >> 1,0));
  SetIsConst(this,i,SUB41((*(ushort *)&sym->field_0x42 & 4) >> 2,0));
  SetIsFuncExpr(this,i,SUB41((*(ushort *)&sym->field_0x42 & 0x20) >> 5,0));
  SetIsModuleExportStorage
            (this,i,(bool)((byte)((ushort)*(undefined2 *)&sym->field_0x42 >> 0xe) & 1));
  SetIsModuleImport(this,i,SUB21((ushort)*(undefined2 *)&sym->field_0x42 >> 0xf,0));
  SetNeedDeclaration(this,i,(bool)((byte)*(undefined2 *)&sym->field_0x42 & 1));
LAB_007dc587:
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
  if (bVar2) {
    Output::Print(L"%12s %d\n",(sym->name).string.ptr,(ulong)(uint)sym->scopeSlot);
    return;
  }
  return;
}

Assistant:

void ScopeInfo::SaveSymbolInfo(Symbol* sym, MapSymbolData* mapSymbolData)
    {
        bool needScopeSlot = sym->GetHasNonLocalReference();
        Js::PropertyId scopeSlot = Constants::NoSlot;

        if (sym->GetIsModuleExportStorage())
        {
            // Export symbols aren't in slots but we need to persist the fact that they are export storage
            scopeSlot = sym->GetScope()->GetScopeSlotCount() + mapSymbolData->nonScopeSymbolCount++;
        }
        else if (needScopeSlot)
        {
            // Any symbol may have non-local ref from deferred child. Allocate slot for it.
            scopeSlot = sym->EnsureScopeSlot(mapSymbolData->byteCodeGenerator, mapSymbolData->func);
        }

        if (needScopeSlot || sym->GetIsModuleExportStorage())
        {
            Js::PropertyId propertyId = sym->EnsurePosition(mapSymbolData->func);
            this->SetSymbolId(scopeSlot, propertyId);
            this->SetSymbolType(scopeSlot, sym->GetSymbolType());
            this->SetHasFuncAssignment(scopeSlot, sym->GetHasFuncAssignment());
            this->SetIsBlockVariable(scopeSlot, sym->GetIsBlockVar());
            this->SetIsConst(scopeSlot, sym->GetIsConst());
            this->SetIsFuncExpr(scopeSlot, sym->GetIsFuncExpr());
            this->SetIsModuleExportStorage(scopeSlot, sym->GetIsModuleExportStorage());
            this->SetIsModuleImport(scopeSlot, sym->GetIsModuleImport());
            this->SetNeedDeclaration(scopeSlot, sym->GetNeedDeclaration());
        }

        TRACE_BYTECODE(_u("%12s %d\n"), sym->GetName().GetBuffer(), sym->GetScopeSlot());
    }